

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<QGesture_*> * __thiscall
QHash<QGesture_*,_QGestureRecognizer_*>::keys
          (QList<QGesture_*> *__return_storage_ptr__,QHash<QGesture_*,_QGestureRecognizer_*> *this,
          QGestureRecognizer **value)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGesture **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_30 = (piter)begin(this);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QGesture_*,_QGestureRecognizer_*>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar2 = (local_30.d)->spans;
    uVar4 = local_30.bucket >> 7;
    pEVar3 = pSVar2[uVar4].entries;
    bVar1 = pSVar2[uVar4].offsets[(uint)local_30.bucket & 0x7f];
    if (*(QGestureRecognizer **)(pEVar3[bVar1].storage.data + 8) == *value) {
      QList<QGesture_*>::append
                (__return_storage_ptr__,*(parameter_type *)pEVar3[bVar1].storage.data);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QGestureRecognizer_*>_>::operator++
              (&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<Key> keys(const T &value) const
    {
        QList<Key> res;
        const_iterator i = begin();
        while (i != end()) {
            if (i.value() == value)
                res.append(i.key());
            ++i;
        }
        return res;
    }